

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  ExprList *pEVar1;
  int iVar2;
  ExprList_item *pEVar3;
  int iVar4;
  
  if (pList != (Window *)0x0) {
    do {
      pEVar1 = pList->pOrderBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar3 = pEVar1->a;
        iVar4 = pEVar1->nExpr + 1;
        do {
          iVar2 = sqlite3WalkExpr(pWalker,pEVar3->pExpr);
          if (iVar2 != 0) {
            return 2;
          }
          pEVar3 = pEVar3 + 1;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
      pEVar1 = pList->pPartition;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar3 = pEVar1->a;
        iVar4 = pEVar1->nExpr + 1;
        do {
          iVar2 = sqlite3WalkExpr(pWalker,pEVar3->pExpr);
          if (iVar2 != 0) {
            return 2;
          }
          pEVar3 = pEVar3 + 1;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
      if (((pList->pFilter != (Expr *)0x0) &&
          (iVar4 = sqlite3WalkExprNN(pWalker,pList->pFilter), iVar4 != 0)) ||
         ((pList->pStart != (Expr *)0x0 &&
          (iVar4 = sqlite3WalkExprNN(pWalker,pList->pStart), iVar4 != 0)))) {
        return 2;
      }
      if (pList->pEnd == (Expr *)0x0) {
        if (bOneOnly != 0) {
          return 0;
        }
      }
      else {
        iVar4 = sqlite3WalkExprNN(pWalker,pList->pEnd);
        if (iVar4 != 0 || bOneOnly != 0) {
          return (uint)(iVar4 != 0) * 2;
        }
      }
      pList = pList->pNextWin;
    } while (pList != (Window *)0x0);
  }
  return 0;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}